

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

HighsStatus applyScalingToLpRow(HighsLp *lp,HighsInt row,double rowScale)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  HighsStatus HVar4;
  
  if ((((rowScale != 0.0) || (HVar4 = kError, NAN(rowScale))) && (HVar4 = kError, -1 < row)) &&
     (row < lp->num_row_)) {
    HighsSparseMatrix::scaleRow(&lp->a_matrix_,row,rowScale);
    pdVar2 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = pdVar2[(uint)row];
    if (rowScale <= 0.0) {
      pdVar3 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(uint)row] = rowScale * pdVar3[(uint)row];
      pdVar3[(uint)row] = dVar1 * rowScale;
    }
    else {
      pdVar2[(uint)row] = dVar1 * rowScale;
      pdVar2 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[(uint)row] = rowScale * pdVar2[(uint)row];
    }
    HVar4 = kOk;
  }
  return HVar4;
}

Assistant:

HighsStatus applyScalingToLpRow(HighsLp& lp, const HighsInt row,
                                const double rowScale) {
  if (row < 0) return HighsStatus::kError;
  if (row >= lp.num_row_) return HighsStatus::kError;
  if (!rowScale) return HighsStatus::kError;

  lp.a_matrix_.scaleRow(row, rowScale);
  if (rowScale > 0) {
    lp.row_lower_[row] *= rowScale;
    lp.row_upper_[row] *= rowScale;
  } else {
    const double new_upper = lp.row_lower_[row] * rowScale;
    lp.row_lower_[row] = lp.row_upper_[row] * rowScale;
    lp.row_upper_[row] = new_upper;
  }
  return HighsStatus::kOk;
}